

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_foreach(lua_State *L)

{
  int *piVar1;
  int iVar2;
  TValue *key;
  GCfunc *pGVar3;
  GCtab *in_RDI;
  GCfunc *func;
  GCtab *t;
  undefined8 in_stack_ffffffffffffff78;
  lua_State *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  key = (TValue *)lj_lib_checktab(in_stack_ffffffffffffff80,iVar2);
  pGVar3 = lj_lib_checkfunc((lua_State *)&key->field_2,iVar2);
  *(long *)&in_RDI->asize = *(long *)&in_RDI->metatable + 0x18;
  *(undefined4 *)(*(long *)&in_RDI->asize + -4) = 0xffffffff;
  while( true ) {
    iVar2 = lj_tab_next((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_RDI,key);
    if (iVar2 == 0) {
      return 0;
    }
    *(undefined8 *)(*(long *)&in_RDI->asize + 0x10) = **(undefined8 **)&in_RDI->asize;
    *(undefined8 *)(*(long *)&in_RDI->asize + 8) = *(undefined8 *)(*(long *)&in_RDI->asize + -8);
    piVar1 = *(int **)&in_RDI->asize;
    *piVar1 = (int)pGVar3;
    piVar1[1] = -9;
    *(long *)&in_RDI->asize = *(long *)&in_RDI->asize + 0x18;
    lua_call((lua_State *)&key->field_2,(int)((ulong)pGVar3 >> 0x20),(int)pGVar3);
    if (*(int *)(*(long *)&in_RDI->asize + -4) != -1) break;
    *(long *)&in_RDI->asize = *(long *)&in_RDI->asize + -8;
  }
  return 1;
}

Assistant:

LJLIB_CF(table_foreach)
{
  GCtab *t = lj_lib_checktab(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  L->top = L->base+3;
  setnilV(L->top-1);
  while (lj_tab_next(L, t, L->top-1)) {
    copyTV(L, L->top+2, L->top);
    copyTV(L, L->top+1, L->top-1);
    setfuncV(L, L->top, func);
    L->top += 3;
    lua_call(L, 2, 1);
    if (!tvisnil(L->top-1))
      return 1;
    L->top--;
  }
  return 0;
}